

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute-eval-typed.cc
# Opt level: O1

bool tinyusdz::tydra::
     EvaluateTypedAttribute<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
               (Stage *stage,
               TypedAttribute<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
               *tattr,string *attr_name,
               vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *value_out,
               string *err)

{
  TypedAttribute<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
  TVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  ostream *poVar6;
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  TerminalAttributeValue value;
  ostringstream ss_e;
  long *local_5a8 [2];
  long local_598 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  string local_568;
  string local_548;
  undefined1 local_528 [528];
  _Rb_tree_color local_318;
  _Base_ptr local_310;
  _Base_ptr local_308;
  _Base_ptr local_300;
  size_t local_2f8;
  pointer pSStack_2f0;
  pointer local_2e8;
  pointer pSStack_2e0;
  undefined1 local_2d8 [40];
  _Alloc_hider local_2b0;
  size_type local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  storage_union local_290;
  vtable_type *local_280;
  bool local_278;
  undefined1 local_270 [8];
  ios_base iStack_268;
  undefined7 uStack_267;
  undefined1 uStack_260;
  undefined8 uStack_25f;
  undefined1 local_250 [24];
  AttrMetas AStack_238;
  
  if (value_out == (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)0x0)
  {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/attribute-eval-typed.cc"
               ,100);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2d8,"EvaluateTypedAttribute",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2d8,0x88);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2d8,"`value_out` param is nullptr.",0x1d);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2d8,"\n",1);
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,local_528._0_8_);
      if ((void *)local_528._0_8_ != (void *)((long)local_528 + 0x10U)) {
        operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d8);
    ::std::ios_base::~ios_base(&iStack_268);
  }
  else {
    if (tattr[0x248] !=
        (TypedAttribute<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
         )0x1) {
      lVar2 = *(long *)(tattr + 0x210);
      lVar3 = *(long *)(tattr + 0x218);
      if (((lVar3 != lVar2) ||
          (tattr[0x228] !=
           (TypedAttribute<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
            )0x0)) ||
         (tattr[0x208] !=
          (TypedAttribute<std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>_>
           )0x1)) {
        TVar1 = tattr[0x228];
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71((int7)((ulong)lVar3 >> 8),lVar3 == lVar2 | (byte)TVar1);
        if (lVar3 != lVar2 && ((byte)TVar1 & 1) == 0) {
          local_2d8._0_8_ = local_2d8 + 0x10;
          local_2d8._8_8_ = 0;
          local_2d8[0x10] = '\0';
          local_2d8._32_4_ = Varying;
          local_2d8[0x24] = false;
          local_2b0._M_p = (pointer)&local_2a0;
          local_2a8 = 0;
          local_2a0._M_local_buf[0] = '\0';
          local_280 = (vtable_type *)&linb::any::vtable_for_type<decltype(nullptr)>()::table;
          local_290.dynamic = (void *)0x0;
          local_278 = false;
          local_270 = (undefined1  [8])0x0;
          iStack_268 = (ios_base)0x0;
          uStack_267 = 0;
          uStack_260 = 0;
          uStack_25f = 0;
          AStack_238.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
          AStack_238.elementSize.has_value_ = false;
          AStack_238.elementSize.contained = (storage_t<unsigned_int>)0x0;
          AStack_238.hidden.has_value_ = false;
          AStack_238.hidden.contained = (storage_t<bool>)0x0;
          AStack_238.comment.has_value_ = false;
          AStack_238.weight.contained = (storage_t<double>)0x0;
          AStack_238.connectability.has_value_ = false;
          AStack_238.bindMaterialAs.contained._16_8_ = 0;
          AStack_238.bindMaterialAs.contained._24_8_ = 0;
          AStack_238.bindMaterialAs.contained.data.__align =
               (anon_struct_8_0_00000001_for___align)0x0;
          AStack_238.bindMaterialAs.contained._8_8_ = 0;
          AStack_238.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &AStack_238.meta._M_t._M_impl.super__Rb_tree_header._M_header;
          AStack_238.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          AStack_238.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          AStack_238.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_238.comment.contained._8_8_ = 0;
          AStack_238.comment.contained._16_8_ = 0;
          AStack_238.comment.contained._24_8_ = 0;
          AStack_238.comment.contained._32_8_ = 0;
          AStack_238.comment.contained._40_8_ = 0;
          AStack_238.customData.has_value_ = false;
          AStack_238.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_238.customData.contained._8_8_ = 0;
          AStack_238.customData.contained._16_8_ = 0;
          AStack_238.customData.contained._24_8_ = 0;
          AStack_238.customData.contained._32_8_ = 0;
          AStack_238.customData.contained._40_8_ = 0;
          AStack_238.weight.has_value_ = false;
          AStack_238.connectability.contained.data.__align =
               (anon_struct_8_0_00000001_for___align)0x0;
          AStack_238.connectability.contained._8_8_ = 0;
          AStack_238.connectability.contained._16_8_ = 0;
          AStack_238.connectability.contained._24_8_ = 0;
          AStack_238.outputName.has_value_ = false;
          AStack_238.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_238.outputName.contained._8_8_ = 0;
          AStack_238.outputName.contained._16_8_ = 0;
          AStack_238.outputName.contained._24_8_ = 0;
          AStack_238.renderType.has_value_ = false;
          AStack_238.sdrMetadata.has_value_ = false;
          AStack_238.renderType.contained._16_8_ = 0;
          AStack_238.renderType.contained._24_8_ = 0;
          AStack_238.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_238.renderType.contained._8_8_ = 0;
          AStack_238.displayName.has_value_ = false;
          AStack_238.sdrMetadata.contained._32_8_ = 0;
          AStack_238.sdrMetadata.contained._40_8_ = 0;
          AStack_238.sdrMetadata.contained._16_8_ = 0;
          AStack_238.sdrMetadata.contained._24_8_ = 0;
          AStack_238.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_238.sdrMetadata.contained._8_8_ = 0;
          AStack_238.displayGroup.has_value_ = false;
          AStack_238.displayName.contained._16_8_ = 0;
          AStack_238.displayName.contained._24_8_ = 0;
          AStack_238.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          AStack_238.displayName.contained._8_8_ = 0;
          AStack_238.bindMaterialAs.has_value_ = false;
          AStack_238.displayGroup.contained._16_8_ = 0;
          AStack_238.displayGroup.contained._24_8_ = 0;
          AStack_238.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
          ;
          AStack_238.displayGroup.contained._8_8_ = 0;
          local_250[0x10] = 0;
          stack0xfffffffffffffdc1 = 0;
          local_250._0_8_ = (pointer)0x0;
          local_250[8] = 0;
          local_250._9_7_ = 0;
          AStack_238.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          AStack_238.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          AStack_238.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          AStack_238.stringData.
          super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          AStack_238.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               AStack_238.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if (((byte)TVar1 & 1) == 0) {
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_250,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(tattr + 0x210));
          }
          else {
            tinyusdz::value::
            TypeTraits<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>::
            type_name_abi_cxx11_();
            ::std::__cxx11::string::_M_assign((string *)&local_2b0);
            if ((void *)local_528._0_8_ != (void *)((long)local_528 + 0x10U)) {
              operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
            }
            local_2d8._32_4_ = Uniform;
          }
          local_528._8_8_ = &(((TerminalAttributeValue *)local_528)->_type_name).field_2;
          local_528[0] = (fmt)0x1;
          bVar4 = false;
          local_528._16_8_ = 0;
          local_528[0x18] = '\0';
          local_528._40_4_ = Varying;
          local_528._64_8_ = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
          local_528._48_8_ = (void *)0x0;
          local_528[0x48] = false;
          local_528._76_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
          local_528[0x50] = false;
          local_528._84_4_ = (storage_t<unsigned_int>)0x0;
          local_528[0x58] = false;
          local_528[0x59] = (storage_t<bool>)0x0;
          local_528[0x60] = false;
          local_528._216_8_ = (storage_t<double>)0x0;
          local_528[0xe0] = false;
          local_528._488_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_528._496_8_ = 0;
          local_528._504_8_ = 0;
          local_528._512_8_ = 0;
          local_308 = &(((TerminalAttributeValue *)local_528)->_meta).meta._M_t._M_impl.
                       super__Rb_tree_header._M_header;
          local_318 = _S_red;
          local_310 = (_Base_ptr)0x0;
          local_528[0x98] = false;
          local_528._136_8_ = 0;
          local_528._144_8_ = 0;
          local_528._120_8_ = 0;
          local_528._128_8_ = 0;
          local_528._104_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_528._112_8_ = 0;
          local_528._160_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_528._168_8_ = 0;
          local_528._176_8_ = 0;
          local_528._184_8_ = 0;
          local_528._192_8_ = 0;
          local_528._200_8_ = 0;
          local_528[0xd0] = false;
          local_528._232_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_528._240_8_ = 0;
          local_528._248_8_ = 0;
          local_528._256_8_ = 0;
          local_528[0x108] = false;
          local_528._272_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_528._280_8_ = 0;
          local_528._288_8_ = 0;
          local_528._296_8_ = 0;
          local_528[0x130] = false;
          local_528._312_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_528._320_8_ = 0;
          local_528._328_8_ = 0;
          local_528._336_8_ = 0;
          local_528[0x158] = false;
          local_528._352_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_528._360_8_ = 0;
          local_528._368_8_ = 0;
          local_528._376_8_ = 0;
          local_528._384_8_ = 0;
          local_528._392_8_ = 0;
          local_528[400] = false;
          local_528[0x1b8] = false;
          local_528._424_8_ = 0;
          local_528._432_8_ = 0;
          local_528._408_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_528._416_8_ = 0;
          local_528[0x1e0] = false;
          local_528._464_8_ = 0;
          local_528._472_8_ = 0;
          local_528._448_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_528._456_8_ = 0;
          local_2f8 = 0;
          pSStack_2f0 = (pointer)0x0;
          local_2e8 = (pointer)0x0;
          pSStack_2e0 = (pointer)0x0;
          args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_300 = local_308;
          bVar5 = EvaluateAttribute(stage,(Attribute *)local_2d8,attr_name,
                                    (TerminalAttributeValue *)local_528,err,NAN,Held);
          if (bVar5) {
            if (local_528[0] == (fmt)0x0) {
              __x = tinyusdz::value::Value::
                    as<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                              ((Value *)&((TerminalAttributeValue *)local_528)->_value,false);
            }
            else {
              __x = (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)0x0;
            }
            if (__x == (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                       0x0) {
              bVar4 = true;
              if (err != (string *)0x0) {
                local_5a8[0] = local_598;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_5a8,
                           "Type mismatch. Value producing attribute has type {}, but requested type is {}. Attribute: {}"
                           ,"");
                TerminalAttributeValue::type_name_abi_cxx11_
                          (&local_568,(TerminalAttributeValue *)local_528);
                tinyusdz::value::
                TypeTraits<std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>>
                ::type_name_abi_cxx11_();
                fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          (&local_548,(fmt *)local_5a8,&local_568,&local_588,attr_name,args_2);
                ::std::__cxx11::string::_M_append((char *)err,(ulong)local_548._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_548._M_dataplus._M_p != &local_548.field_2) {
                  operator_delete(local_548._M_dataplus._M_p,
                                  local_548.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_588._M_dataplus._M_p != &local_588.field_2) {
                  operator_delete(local_588._M_dataplus._M_p,
                                  local_588.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_568._M_dataplus._M_p != &local_568.field_2) {
                  operator_delete(local_568._M_dataplus._M_p,
                                  local_568.field_2._M_allocated_capacity + 1);
                }
                if (local_5a8[0] != local_598) {
                  operator_delete(local_5a8[0],local_598[0] + 1);
                }
              }
            }
            else {
              ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
              operator=(value_out,__x);
              bVar4 = false;
            }
          }
          AttrMetas::~AttrMetas(&((TerminalAttributeValue *)local_528)->_meta);
          if ((vtable_type *)local_528._64_8_ != (vtable_type *)0x0) {
            (**(_func_void_storage_union_ptr **)(local_528._64_8_ + 0x20))
                      ((storage_union *)&((TerminalAttributeValue *)local_528)->_value);
            local_528._64_8_ = (vtable_type *)0x0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_528._8_8_ != &(((TerminalAttributeValue *)local_528)->_type_name).field_2) {
            operator_delete((void *)local_528._8_8_,CONCAT71(local_528._25_7_,local_528[0x18]) + 1);
          }
          AttrMetas::~AttrMetas(&AStack_238);
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_250);
          ::std::
          vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     *)local_270);
          if (local_280 != (vtable_type *)0x0) {
            (*local_280->destroy)(&local_290);
            local_280 = (vtable_type *)0x0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_p != &local_2a0) {
            operator_delete(local_2b0._M_p,
                            CONCAT71(local_2a0._M_allocated_capacity._1_7_,local_2a0._M_local_buf[0]
                                    ) + 1);
          }
          if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
            operator_delete((void *)local_2d8._0_8_,CONCAT71(local_2d8._17_7_,local_2d8[0x10]) + 1);
          }
          if (bVar4) {
            return false;
          }
          return bVar5;
        }
        if (((byte)TVar1 & 1) != 0) {
          ::std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::operator=
                    (value_out,
                     (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)
                     (tattr + 0x230));
          return true;
        }
        if (err == (string *)0x0) {
          return false;
        }
        local_528._0_8_ = (void *)((long)local_528 + 0x10U);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_528,"[Internal error] Invalid TypedAttribute? : {} \n","");
        fmt::format<std::__cxx11::string>
                  ((string *)local_2d8,(fmt *)local_528,(string *)attr_name,args);
        ::std::__cxx11::string::_M_append((char *)err,local_2d8._0_8_);
        if ((undefined1 *)local_2d8._0_8_ != local_2d8 + 0x10) {
          operator_delete((void *)local_2d8._0_8_,CONCAT71(local_2d8._17_7_,local_2d8[0x10]) + 1);
        }
        if ((void *)local_528._0_8_ == (void *)((long)local_528 + 0x10U)) {
          return false;
        }
        operator_delete((void *)local_528._0_8_,local_528._16_8_ + 1);
        return false;
      }
    }
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
  }
  return false;
}

Assistant:

bool EvaluateTypedAttribute(
    const tinyusdz::Stage &stage, const TypedAttribute<T> &tattr,
    const std::string &attr_name,
    T *value_out,
    std::string *err) {

  if (!value_out) {
    PUSH_ERROR_AND_RETURN("`value_out` param is nullptr.");
  }

  if (tattr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is Blocked.\n";
    }
    return false;
  } else if (tattr.is_value_empty()) {
    if (err) {
      (*err) += "Attribute value is empty.\n";
    }
    return false;
  } else if (tattr.is_connection()) {

    // Follow targetPath 
    Attribute attr = ToAttributeConnection(tattr);

    //std::set<std::string> visited_paths;

    TerminalAttributeValue value;
    bool ret = EvaluateAttribute(stage, attr, attr_name, &value, err,
                                 value::TimeCode::Default(), value::TimeSampleInterpolationType::Held);

    if (!ret) {
      return false;
    }

    if (auto pv = value.as<T>()) {
      (*value_out) = *pv;
      return true;
    }

    if (err) {
      (*err) += fmt::format("Type mismatch. Value producing attribute has type {}, but requested type is {}. Attribute: {}", value.type_name(), tattr.type_name(), attr_name);
    }

  } else {
    if (tattr.get_value(value_out)) {
      return true;
    }

    if (err) {
      (*err) += fmt::format("[Internal error] Invalid TypedAttribute? : {} \n", attr_name);
    }
  }
  return false;
}